

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O2

int MPIABI_Status_set_cancelled(MPIABI_Status *status,int flag)

{
  int iVar1;
  WPI_StatusPtr local_10;
  
  local_10.wrapped_status_ptr = (WPI_Status *)status;
  iVar1 = MPI_Status_set_cancelled();
  WPI_StatusPtr::~WPI_StatusPtr(&local_10);
  return iVar1;
}

Assistant:

int MPIABI_Status_set_cancelled(
  MPIABI_Status * status,
  int flag
) {
  return MPI_Status_set_cancelled(
    (MPI_Status *)(WPI_StatusPtr)status,
    flag
  );
}